

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqcompiler.cpp
# Opt level: O0

void __thiscall SQCompiler::FunctionExp(SQCompiler *this,SQInteger ftype,bool lambda)

{
  SQObjectPtr *this_00;
  SQFuncState *in_RDI;
  SQObjectPtr dummy;
  SQInteger in_stack_00000040;
  SQCompiler *in_stack_00000048;
  bool in_stack_00000087;
  SQObject *in_stack_00000088;
  SQCompiler *in_stack_00000090;
  SQCompiler *in_stack_ffffffffffffffa0;
  SQObjectPtr *this_01;
  SQInteger in_stack_ffffffffffffffb8;
  SQInteger in_stack_ffffffffffffffc0;
  SQOpcode in_stack_ffffffffffffffcc;
  SQObjectValue in_stack_ffffffffffffffd0;
  
  Lex(in_stack_ffffffffffffffa0);
  Expect(in_stack_00000048,in_stack_00000040);
  this_01 = (SQObjectPtr *)&stack0xffffffffffffffc8;
  ::SQObjectPtr::SQObjectPtr(this_01);
  CreateFunction(in_stack_00000090,in_stack_00000088,in_stack_00000087);
  this_00 = (SQObjectPtr *)SQFuncState::PushTarget(in_RDI,(SQInteger)in_stack_ffffffffffffffa0);
  sqvector<SQObjectPtr>::size((sqvector<SQObjectPtr> *)((in_RDI->_vlocals)._vals + 3));
  SQFuncState::AddInstruction
            ((SQFuncState *)in_stack_ffffffffffffffd0.pTable,in_stack_ffffffffffffffcc,
             in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,(SQInteger)this_01,
             (SQInteger)in_RDI);
  ::SQObjectPtr::~SQObjectPtr(this_00);
  return;
}

Assistant:

void FunctionExp(SQInteger ftype,bool lambda = false)
    {
        Lex(); Expect(_SC('('));
        SQObjectPtr dummy;
        CreateFunction(dummy,lambda);
        _fs->AddInstruction(_OP_CLOSURE, _fs->PushTarget(), _fs->_functions.size() - 1, ftype == TK_FUNCTION?0:1);
    }